

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSynchronizationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_1::InterCallTestCase::runCommand
          (InterCallTestCase *this,ReadMultipleData *cmd,int stepNdx,int *programFriendlyName,
          int *resultStorageFriendlyName)

{
  code *pcVar1;
  int iVar2;
  deUint32 dVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *this_00;
  MessageBuilder *pMVar5;
  reference ppSVar6;
  mapped_type_conflict *pmVar7;
  reference pvVar8;
  undefined8 uVar9;
  undefined4 uVar10;
  char *local_1d0 [3];
  MessageBuilder local_1b8;
  long local_38;
  Functions *gl;
  int *resultStorageFriendlyName_local;
  int *programFriendlyName_local;
  ReadMultipleData *pRStack_18;
  int stepNdx_local;
  ReadMultipleData *cmd_local;
  InterCallTestCase *this_local;
  
  gl = (Functions *)resultStorageFriendlyName;
  resultStorageFriendlyName_local = programFriendlyName;
  programFriendlyName_local._4_4_ = stepNdx;
  pRStack_18 = cmd;
  cmd_local = (ReadMultipleData *)this;
  pRVar4 = Context::getRenderContext((this->super_TestCase).m_context);
  iVar2 = (*pRVar4->_vptr_RenderContext[3])();
  local_38 = CONCAT44(extraout_var,iVar2);
  this_00 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)
  ;
  tcu::TestLog::operator<<(&local_1b8,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  pMVar5 = tcu::MessageBuilder::operator<<(&local_1b8,(char (*) [18])"Running program #");
  *resultStorageFriendlyName_local = *resultStorageFriendlyName_local + 1;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,resultStorageFriendlyName_local);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [12])" to verify ");
  local_1d0[0] = "images";
  if (this->m_storage == STORAGE_BUFFER) {
    local_1d0[0] = "buffers";
  }
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,local_1d0);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xf36209);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pRStack_18->targetHandle0);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [7])" and #");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&pRStack_18->targetHandle1);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xfb38cd);
  pMVar5 = tcu::MessageBuilder::operator<<
                     (pMVar5,(char (*) [37])"\tWriting results to result storage #");
  *(int *)&gl->activeShaderProgram = *(int *)&gl->activeShaderProgram + 1;
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(int *)gl);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [3])0xfb38cd);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [17])"\tDispatch size: ");
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_invocationGridSize);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0xfb29fd);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,&this->m_invocationGridSize);
  pMVar5 = tcu::MessageBuilder::operator<<(pMVar5,(char (*) [2])0xf5dc26);
  tcu::MessageBuilder::operator<<(pMVar5,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_1b8);
  pcVar1 = *(code **)(local_38 + 0x1680);
  ppSVar6 = std::vector<glu::ShaderProgram_*,_std::allocator<glu::ShaderProgram_*>_>::operator[]
                      (&this->m_operationPrograms,(long)programFriendlyName_local._4_4_);
  dVar3 = glu::ShaderProgram::getProgram(*ppSVar6);
  (*pcVar1)(dVar3);
  if (this->m_storage == STORAGE_BUFFER) {
    pcVar1 = *(code **)(local_38 + 0x48);
    pmVar7 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_storageIDs,&pRStack_18->targetHandle0);
    (*pcVar1)(0x90d2,1,*pmVar7);
    pcVar1 = *(code **)(local_38 + 0x48);
    pmVar7 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_storageIDs,&pRStack_18->targetHandle1);
    (*pcVar1)(0x90d2,2,*pmVar7);
    dVar3 = (**(code **)(local_38 + 0x800))();
    glu::checkError(dVar3,"bind source buffers",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x5fa);
  }
  else if (this->m_storage == STORAGE_IMAGE) {
    pcVar1 = *(code **)(local_38 + 0x80);
    pmVar7 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_storageIDs,&pRStack_18->targetHandle0);
    uVar9 = 35000;
    if ((this->m_useAtomic & 1U) != 0) {
      uVar9 = 0x88ba;
    }
    uVar10 = 0x822e;
    if ((this->m_formatInteger & 1U) != 0) {
      uVar10 = 0x8235;
    }
    (*pcVar1)(1,*pmVar7,0,0,0,uVar9,uVar10);
    pcVar1 = *(code **)(local_38 + 0x80);
    pmVar7 = std::
             map<int,_unsigned_int,_std::less<int>,_std::allocator<std::pair<const_int,_unsigned_int>_>_>
             ::operator[](&this->m_storageIDs,&pRStack_18->targetHandle1);
    uVar9 = 35000;
    if ((this->m_useAtomic & 1U) != 0) {
      uVar9 = 0x88ba;
    }
    uVar10 = 0x822e;
    if ((this->m_formatInteger & 1U) != 0) {
      uVar10 = 0x8235;
    }
    (*pcVar1)(2,*pmVar7,0,0,0,uVar9,uVar10);
    dVar3 = (**(code **)(local_38 + 0x800))();
    glu::checkError(dVar3,"bind source images",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                    ,0x603);
  }
  pcVar1 = *(code **)(local_38 + 0x48);
  pvVar8 = std::vector<unsigned_int,_std::allocator<unsigned_int>_>::operator[]
                     (&this->m_operationResultStorages,(long)programFriendlyName_local._4_4_);
  (*pcVar1)(0x90d2,0,*pvVar8);
  dVar3 = (**(code **)(local_38 + 0x800))();
  glu::checkError(dVar3,"bind result buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x60b);
  (**(code **)(local_38 + 0x528))(this->m_invocationGridSize,this->m_invocationGridSize,1);
  dVar3 = (**(code **)(local_38 + 0x800))();
  glu::checkError(dVar3,"dispatch read multi",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fSynchronizationTests.cpp"
                  ,0x60f);
  return;
}

Assistant:

void InterCallTestCase::runCommand (const op::ReadMultipleData& cmd, int stepNdx, int& programFriendlyName, int& resultStorageFriendlyName)
{
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	m_testCtx.getLog()
		<< tcu::TestLog::Message
		<< "Running program #" << ++programFriendlyName << " to verify " << ((m_storage == STORAGE_BUFFER) ? ("buffers") : ("images")) << " #" << cmd.targetHandle0 << " and #" << cmd.targetHandle1 << ".\n"
		<< "	Writing results to result storage #" << ++resultStorageFriendlyName << ".\n"
		<< "	Dispatch size: " << m_invocationGridSize << "x" << m_invocationGridSize << "."
		<< tcu::TestLog::EndMessage;

	gl.useProgram(m_operationPrograms[stepNdx]->getProgram());

	// set sources
	if (m_storage == STORAGE_BUFFER)
	{
		DE_ASSERT(m_storageIDs[cmd.targetHandle0]);
		DE_ASSERT(m_storageIDs[cmd.targetHandle1]);

		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 1, m_storageIDs[cmd.targetHandle0]);
		gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 2, m_storageIDs[cmd.targetHandle1]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind source buffers");
	}
	else if (m_storage == STORAGE_IMAGE)
	{
		DE_ASSERT(m_storageIDs[cmd.targetHandle0]);
		DE_ASSERT(m_storageIDs[cmd.targetHandle1]);

		gl.bindImageTexture(1, m_storageIDs[cmd.targetHandle0], 0, GL_FALSE, 0, (m_useAtomic) ? (GL_READ_WRITE) : (GL_READ_ONLY), (m_formatInteger) ? (GL_R32I) : (GL_R32F));
		gl.bindImageTexture(2, m_storageIDs[cmd.targetHandle1], 0, GL_FALSE, 0, (m_useAtomic) ? (GL_READ_WRITE) : (GL_READ_ONLY), (m_formatInteger) ? (GL_R32I) : (GL_R32F));
		GLU_EXPECT_NO_ERROR(gl.getError(), "bind source images");
	}
	else
		DE_ASSERT(DE_FALSE);

	// set destination
	DE_ASSERT(m_operationResultStorages[stepNdx]);
	gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, m_operationResultStorages[stepNdx]);
	GLU_EXPECT_NO_ERROR(gl.getError(), "bind result buffer");

	// calc
	gl.dispatchCompute(m_invocationGridSize, m_invocationGridSize, 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "dispatch read multi");
}